

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

xxh_u64 XXH64_finalize(xxh_u64 h64,xxh_u8 *ptr,size_t len,XXH_alignment align)

{
  xxh_u32 xVar1;
  xxh_u64 xVar2;
  ulong in_RDX;
  byte *in_RSI;
  ulong in_RDI;
  xxh_u64 k1;
  void *in_stack_ffffffffffffffd8;
  ulong local_18;
  byte *local_10;
  ulong local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_18 = in_RDX & 0x1f; 7 < local_18; local_18 = local_18 - 8) {
    xVar2 = XXH_readLE64_align(in_stack_ffffffffffffffd8,XXH_aligned);
    in_stack_ffffffffffffffd8 = (void *)XXH64_round(0,xVar2);
    local_10 = local_10 + 8;
    local_8 = (((ulong)in_stack_ffffffffffffffd8 ^ local_8) << 0x1b |
              ((ulong)in_stack_ffffffffffffffd8 ^ local_8) >> 0x25) * -0x61c8864e7a143579 +
              0x85ebca77c2b2ae63;
  }
  if (3 < local_18) {
    xVar1 = XXH_readLE32_align(in_stack_ffffffffffffffd8,XXH_aligned);
    local_8 = (ulong)xVar1 * -0x61c8864e7a143579 ^ local_8;
    local_10 = local_10 + 4;
    local_8 = (local_8 << 0x17 | local_8 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    local_18 = local_18 - 4;
  }
  for (; local_18 != 0; local_18 = local_18 - 1) {
    local_8 = (ulong)*local_10 * 0x27d4eb2f165667c5 ^ local_8;
    local_8 = (local_8 << 0xb | local_8 >> 0x35) * -0x61c8864e7a143579;
    local_10 = local_10 + 1;
  }
  xVar2 = XXH64_avalanche(local_8);
  return xVar2;
}

Assistant:

static xxh_u64
XXH64_finalize(xxh_u64 h64, const xxh_u8* ptr, size_t len, XXH_alignment align)
{
    if (ptr==NULL) XXH_ASSERT(len == 0);
    len &= 31;
    while (len >= 8) {
        xxh_u64 const k1 = XXH64_round(0, XXH_get64bits(ptr));
        ptr += 8;
        h64 ^= k1;
        h64  = XXH_rotl64(h64,27) * XXH_PRIME64_1 + XXH_PRIME64_4;
        len -= 8;
    }
    if (len >= 4) {
        h64 ^= (xxh_u64)(XXH_get32bits(ptr)) * XXH_PRIME64_1;
        ptr += 4;
        h64 = XXH_rotl64(h64, 23) * XXH_PRIME64_2 + XXH_PRIME64_3;
        len -= 4;
    }
    while (len > 0) {
        h64 ^= (*ptr++) * XXH_PRIME64_5;
        h64 = XXH_rotl64(h64, 11) * XXH_PRIME64_1;
        --len;
    }
    return  XXH64_avalanche(h64);
}